

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.cpp
# Opt level: O2

void boost::deflate::easy_test::test_uncompress(void)

{
  runner *prVar1;
  wrap in_R8B;
  wrap wVar2;
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  prVar1 = test_suite::detail::current()::p;
  easy_uncompress_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_38,(deflate *)0x11a923,(string_view)ZEXT816(0),in_R8B);
  wVar2 = 0x1b;
  test_suite::detail::runner::maybe_fail<boost::optional<std::__cxx11::string>>
            (prVar1,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_38,"easy_uncompress(\"\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x1b,"static void boost::deflate::easy_test::test_uncompress()",(char *)0x0);
  optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&local_38);
  prVar1 = test_suite::detail::current()::p;
  easy_uncompress_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_60,(deflate *)"",(string_view)ZEXT816(0),wVar2);
  wVar2 = 0x1c;
  test_suite::detail::runner::maybe_fail<boost::optional<std::__cxx11::string>>
            (prVar1,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60,
             "easy_uncompress(\"\\x00\\x05\\x00\\xfa\\xff\\x48\\x65\\x6c\\x6c\\x6f\\x00\\x00\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x1c,"static void boost::deflate::easy_test::test_uncompress()",(char *)0x0);
  optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&local_60);
  prVar1 = test_suite::detail::current()::p;
  easy_uncompress_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88,(deflate *)"This is a test string",(string_view)ZEXT816(0x15),wVar2);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,(bool)(local_88.m_initialized ^ 1),"!easy_uncompress(\"This is a test string\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x1d,"static void boost::deflate::easy_test::test_uncompress()",(char *)0x0);
  optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&local_88);
  return;
}

Assistant:

static void test_uncompress() {
      BOOST_TEST(easy_uncompress(""));
      BOOST_TEST(easy_uncompress("\x00\x05\x00\xfa\xff\x48\x65\x6c\x6c\x6f\x00\x00"));
      BOOST_TEST(!easy_uncompress("This is a test string"));
  }